

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_ELSI.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  time_t tVar4;
  FactoredDecPOMDPDiscreteInterface *pFVar5;
  GMAA_MAA_ELSI *this;
  FactoredQFunctionStateJAOHInterface *pFVar6;
  ostream *poVar7;
  size_t sVar8;
  byte bVar9;
  double dVar10;
  double dVar11;
  PlanningUnitMADPDiscreteParameters params;
  string filename;
  string timingsFilename;
  OptimalValueDatabase db;
  tms ts_Qcomp;
  tms ts_before;
  stringstream ss;
  Timing Time;
  char s [10];
  ofstream of;
  Arguments args;
  tms ts_after;
  uint local_7bc;
  PlanningUnitMADPDiscreteParameters local_7b1 [5];
  undefined2 local_7ac;
  undefined1 local_7aa;
  ulong local_7a8;
  long *local_7a0;
  long local_798;
  long local_790 [2];
  long *local_780;
  long local_778;
  long local_770 [2];
  clock_t *local_760;
  clock_t local_758;
  clock_t local_750;
  clock_t local_748;
  long *local_740 [2];
  long local_730 [2];
  long *local_720;
  long local_718;
  long local_710 [4];
  long *local_6f0;
  long local_6e0 [2];
  long *local_6d0;
  long local_6c0 [4];
  tms local_6a0;
  tms local_680;
  char *local_660;
  long *local_658;
  long local_650;
  long local_648 [14];
  ios_base local_5d8 [264];
  Timing local_4d0 [62];
  char local_492 [10];
  long *local_488;
  filebuf local_480 [8];
  long local_478 [2];
  uint auStack_468 [54];
  ios_base local_390 [264];
  Arguments local_288;
  tms local_50;
  
  ArgumentHandlers::Arguments::Arguments(&local_288);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&local_288);
  local_7a8 = (ulong)local_288.horizon;
  Timing::Timing(local_4d0);
  local_488 = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Overall","");
  Timing::Start((string *)local_4d0);
  if (local_488 != local_478) {
    operator_delete(local_488,local_478[0] + 1);
  }
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  pFVar5 = (FactoredDecPOMDPDiscreteInterface *)
           ArgumentUtils::GetFactoredDecPOMDPDiscreteInterfaceFromArgs(&local_288);
  (**(code **)(*(long *)(pFVar5 + *(long *)(*(long *)pFVar5 + -0xf8)) + 0x210))
            (pFVar5 + *(long *)(*(long *)pFVar5 + -0xf8),local_288.sparse != 0);
  local_780 = local_770;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"");
  local_740[0] = local_730;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"");
  std::ofstream::ofstream(&local_488);
  local_7bc = 0;
  if (local_288.dryrun == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_658);
    local_680.tms_utime = (clock_t)&local_680.tms_cutime;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"GMAA_ELSI","");
    directories::MADPGetResultsFilename
              ((string *)&local_720,(MultiAgentDecisionProcessInterface *)&local_680,
               (Arguments *)(pFVar5 + *(long *)(*(long *)pFVar5 + -0x40)));
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_648,(char *)local_720,local_718);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
    qheur::SoftPrint_abi_cxx11_((Qheur_t)&local_6a0);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_6a0.tms_utime,local_6a0.tms_stime);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_h",2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_restarts",9);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_288.nrRestarts);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_k",2);
    std::ostream::operator<<(poVar7,local_288.k);
    if ((clock_t *)local_6a0.tms_utime != &local_6a0.tms_cutime) {
      operator_delete((void *)local_6a0.tms_utime,local_6a0.tms_cutime + 1);
    }
    if (local_720 != local_710) {
      operator_delete(local_720,local_710[0] + 1);
    }
    if ((clock_t *)local_680.tms_utime != &local_680.tms_cutime) {
      operator_delete((void *)local_680.tms_utime,local_680.tms_cutime + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_780,(string *)&local_720);
    if (local_720 != local_710) {
      operator_delete(local_720,local_710[0] + 1);
    }
    std::ofstream::open((char *)&local_488,(_Ios_Openmode)local_780);
    uVar1 = *(uint *)((long)auStack_468 + local_488[-3]);
    if ((uVar1 & 5) == 0) {
      local_720 = local_710;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_720,local_780,(long)local_780 + local_778);
      std::__cxx11::string::append((char *)&local_720);
      std::__cxx11::string::operator=((string *)local_740,(string *)&local_720);
      if (local_720 != local_710) {
        operator_delete(local_720,local_710[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Computing ",10);
      std::__cxx11::stringbuf::str();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_720,local_718);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_720 != local_710) {
        operator_delete(local_720,local_710[0] + 1);
      }
      local_7bc = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"GMAA: could not open ",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_780,local_778);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      local_7bc = 1;
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_658);
    std::ios_base::~ios_base(local_5d8);
    bVar2 = false;
    bVar9 = 0;
    if ((uVar1 & 5) != 0) goto LAB_00104eed;
  }
  local_748 = times(&local_680);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_7b1);
  if (3 < (int)local_7a8) {
    local_7ac = 0;
  }
  local_7aa = local_288.sparse != 0;
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"PlanningUnit","");
  Timing::Start((string *)local_4d0);
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  this = (GMAA_MAA_ELSI *)operator_new(0x448);
  GMAA_MAA_ELSI::GMAA_MAA_ELSI(this,local_7a8,pFVar5,local_7b1);
  if (local_288.dryrun == 0) {
    if (local_288.saveTimings != 0) {
      GeneralizedMAAStarPlanner::SetIntermediateTimingFilename((string *)(this + 0x340));
    }
    if (local_288.saveAllBGs != 0) {
      local_658 = local_648;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_658,local_780,(long)local_780 + local_778);
      std::__cxx11::string::append((char *)&local_658);
      std::__cxx11::string::_M_assign((string *)(this + 0x3c0));
      if (local_658 != local_648) {
        operator_delete(local_658,local_648[0] + 1);
      }
    }
  }
  if (local_288.verbose != 0) {
    GeneralizedMAAStarPlanner::SetVerbose((int)this + 0x340);
  }
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"PlanningUnit","");
  Timing::Stop((string *)local_4d0);
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GMAA Planner initialized",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pFVar6 = getQheuristic((GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *)this,
                         local_288.qheur);
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"ComputeQ","");
  Timing::Start((string *)local_4d0);
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  (**(code **)(*(long *)(pFVar6 + *(long *)(*(long *)pFVar6 + -0x60)) + 0x10))
            (pFVar6 + *(long *)(*(long *)pFVar6 + -0x60));
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"ComputeQ","");
  Timing::Stop((string *)local_4d0);
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  times(&local_6a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Q heuristic computed",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  *(FactoredQFunctionStateJAOHInterface **)(this + 0x440) = pFVar6;
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"Plan","");
  Timing::Start((string *)local_4d0);
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  (**(code **)(*(long *)this + 0x18))(this);
  dVar10 = (double)(**(code **)(*(long *)this + 0x98))(this);
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"Plan","");
  Timing::Stop((string *)local_4d0);
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nvalue=",7);
  poVar7 = std::ostream::_M_insert<double>(dVar10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (-1 < local_288.verbose) {
    GeneralizedMAAStarPlanner::GetJointPolicyDiscretePure();
    (**(code **)(*local_658 + 0x38))();
    boost::detail::shared_count::~shared_count((shared_count *)&local_650);
  }
  local_750 = times(&local_50);
  local_758 = local_50.tms_utime;
  local_760 = (clock_t *)local_680.tms_utime;
  local_660 = (char *)local_6a0.tms_utime;
  OptimalValueDatabase::OptimalValueDatabase
            ((OptimalValueDatabase *)&local_720,(PlanningUnitDecPOMDPDiscrete *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"OptimalValueDatabase: entry \'",0x1d);
  OptimalValueDatabase::GetEntryName_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_658,local_650);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  if ((local_288.gmaa == MAAstarClassic) || (local_288.gmaa == MAAstar)) {
    cVar3 = OptimalValueDatabase::IsInDatabase();
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"OptimalValueDatabase: Optimal value unknown.",0x2c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      bVar9 = 1;
      if (local_288.testMode == false) {
        OptimalValueDatabase::SetOptimalValue(dVar10);
        goto LAB_001047e0;
      }
    }
    else {
      cVar3 = OptimalValueDatabase::IsOptimal(dVar10);
      if (cVar3 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_658);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_648,"OptimalValueDatabase: GMAA error, computed value ",0x31);
        poVar7 = std::ostream::_M_insert<double>(dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," does not match",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," previously computed optimal value ",0x23);
        dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
        std::ostream::_M_insert<double>(dVar11);
        std::__cxx11::stringbuf::str();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_488,(char *)local_7a0,local_798);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_7a0 != local_790) {
          operator_delete(local_7a0,local_790[0] + 1);
        }
        std::__cxx11::stringbuf::str();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_7a0,local_798);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_7a0 != local_790) {
          operator_delete(local_7a0,local_790[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_658);
        std::ios_base::~ios_base(local_5d8);
        bVar9 = 1;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "OptimalValueDatabase: Computed value matches with OptimalValueDatabase",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        bVar9 = 0;
      }
    }
  }
  else {
    cVar3 = OptimalValueDatabase::IsInDatabase();
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"OptimalValueDatabase: Optimal value unknown.",0x2c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      bVar9 = local_288.testMode;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"OptimalValueDatabase: Computed value is ",0x28);
      dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
      poVar7 = std::ostream::_M_insert<double>(dVar10 / dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," of optimal (value ",0x13);
      dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
      poVar7 = std::ostream::_M_insert<double>(dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
      if (dVar10 <= dVar11) {
LAB_001047e0:
        bVar9 = 0;
      }
      else {
        bVar9 = 1;
      }
    }
  }
  if (local_288.dryrun == 0) {
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_488,(int)local_7a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    sprintf(local_492,"%.6f",dVar10);
    sVar8 = strlen(local_492);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_488,local_492,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_488,"\t",1);
    poVar7 = std::ostream::_M_insert<long>((long)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    poVar7 = std::ostream::_M_insert<long>((long)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    poVar7 = std::ostream::_M_insert<long>((long)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    poVar7 = std::ostream::_M_insert<long>((long)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    poVar7 = std::ostream::_M_insert<long>((long)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    poVar7 = std::ostream::_M_insert<long>((long)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    GeneralizedMAAStarPlanner::GetJointPolicyDiscretePure();
    (**(code **)(*local_7a0 + 0xa8))(&local_658);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_488,(char *)local_658,local_650);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    if (local_658 != local_648) {
      operator_delete(local_658,local_648[0] + 1);
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_798);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_488,local_288.k);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::ostream::flush();
  }
  local_658 = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"Overall","");
  Timing::Stop((string *)local_4d0);
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  if (-1 < local_288.verbose) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Timing summary",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    Timing::PrintSummary();
    TimedAlgorithm::PrintTimersSummary();
  }
  if ((local_288.saveTimings != 0) && (local_288.dryrun == 0)) {
    TimedAlgorithm::SaveTimers((string *)(this + 0x340));
  }
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0,local_6c0[0] + 1);
  }
  if (local_6f0 != local_6e0) {
    operator_delete(local_6f0,local_6e0[0] + 1);
  }
  std::
  _Rb_tree<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>,_std::_Select1st<std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>_>,_std::less<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>,_std::_Select1st<std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>_>,_std::less<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>_>_>
               *)&local_720);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_7b1);
  bVar2 = true;
LAB_00104eed:
  local_488 = _VTT;
  *(undefined8 *)(local_480 + _VTT[-3] + -8) = _PlanningUnitMADPDiscreteParameters;
  std::filebuf::~filebuf(local_480);
  std::ios_base::~ios_base(local_390);
  if (local_740[0] != local_730) {
    operator_delete(local_740[0],local_730[0] + 1);
  }
  if (local_780 != local_770) {
    operator_delete(local_780,local_770[0] + 1);
  }
  Timing::~Timing(local_4d0);
  if (bVar2) {
    local_7bc = (uint)bVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.maxplus_updateT._M_dataplus._M_p != &local_288.maxplus_updateT.field_2) {
    operator_delete(local_288.maxplus_updateT._M_dataplus._M_p,
                    local_288.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return local_7bc;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    bool errorOccurred=false;

    Qheur_t Qheur=args.qheur;
    int horizon=args.horizon;
    int k=args.k;
    int restarts=args.nrRestarts;
   
    try {

    Timing Time;    
    Time.Start("Overall");

    srand(time(0));

    FactoredDecPOMDPDiscreteInterface* decpomdp = 
        GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
    decpomdp->CacheFlatModels(args.sparse);
    
//    we have no sparse trans., observ. models for FactoredDecPOMDPDiscrete
//    (they are specified by a 2DNB which should be sparse enough)
//     if(args.sparse) 
//         decpomdp->SetSparse(true);

     bool optimalSolutionMethod=false;
     if(args.gmaa==MAAstar || args.gmaa==MAAstarClassic)
         optimalSolutionMethod=true;

    GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *gmaa=0;
    FactoredQFunctionStateJAOHInterface *q;

    string filename="",timingsFilename="";
    ofstream of;
    if(!args.dryrun)
    {
        stringstream ss;
        ss << directories::MADPGetResultsFilename("GMAA_ELSI",
                *decpomdp,args)
           << "_" << SoftPrint(Qheur) << "_h" << horizon << "_restarts"
           << restarts << "_k" << k;
        filename=ss.str();
        of.open(filename.c_str());
        if(!of)
        {
            cerr << "GMAA: could not open " << filename << endl;
            return(1);
        }
        timingsFilename=filename + "Timings";

        cout << "Computing " << ss.str() << endl;
    }
    //tms timeStruct, 
    tms ts_before, ts_Qcomp, ts_after;
    clock_t ticks_before, ticks_Qcomp, ticks_after;
    
    ticks_before = times(&ts_before);

    PlanningUnitMADPDiscreteParameters params;
//    params.SetComputeAll(true);
    if(horizon >= 4)
    {
        params.SetComputeJointBeliefs(false);
        params.SetComputeJointActionObservationHistories(false);
//    params.SetComputeJointBeliefs(false);
//    params.SetUseSparseJointBeliefs(true);
    }
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    double V=-DBL_MAX;
    Time.Start("PlanningUnit");
    
    gmaa=new GMAA_MAA_ELSI(horizon, decpomdp, &params);

    if(!args.dryrun)
    {
        if(args.saveTimings)
            gmaa->SetIntermediateTimingFilename(timingsFilename);

        if(args.saveAllBGs)
        {
            string bgFilename=filename + "_BG";
            gmaa->SetSaveAllBGs(bgFilename);
        }
    }
    if(args.verbose)
        gmaa->SetVerbose(true);

    Time.Stop("PlanningUnit");
    cout << "GMAA Planner initialized" << endl;
    
    q=getQheuristic(gmaa,Qheur);
    Time.Start("ComputeQ");
    q->Compute();
    Time.Stop("ComputeQ");
    ticks_Qcomp = times(&ts_Qcomp);
    cout << "Q heuristic computed" << endl;

    //gmaa->SetQHeuristic(q);
    gmaa->SetFactoredQHeuristic(q);
    Time.Start("Plan");
    gmaa->Plan();
    V = gmaa->GetExpectedReward();
    Time.Stop("Plan");

    cout << "\nvalue="<< V << endl;
    if(args.verbose >= 0)
        gmaa->GetJointPolicyDiscretePure()->Print();

    ticks_after = times(&ts_after);
    clock_t ticks =  ticks_after - ticks_before;
    clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;

    clock_t time_maa = ticks_after - ticks_Qcomp;
    clock_t utime_maa = ts_after.tms_utime - ts_Qcomp.tms_utime;
    clock_t time_Qcomp = ticks_Qcomp - ticks_before;
    clock_t utime_Qcomp = ts_Qcomp.tms_utime - ts_before.tms_utime;

    // check if the value corresponds to the optimal value in case
    // this is an optimal method and we already computed it before
    OptimalValueDatabase db(gmaa);
    cout<<"OptimalValueDatabase: entry '"<<db.GetEntryName()<<"'"<<endl;
    //cout<<db.SoftPrint()<<endl;
    if(optimalSolutionMethod)
    {
        if(db.IsInDatabase())
        {
            if(!db.IsOptimal(V))
            {
                stringstream ss;
                ss << "OptimalValueDatabase: GMAA error, computed value " << V 
                   << " does not match"
                   << " previously computed optimal value "
                   << db.GetOptimalValue();
                of << ss.str() << endl;
                cout << ss.str() << endl;
                errorOccurred=true;
            }
            else
                cout<<"OptimalValueDatabase: Computed value matches with OptimalValueDatabase"<<endl;
        }
        else
        {
            cout << "OptimalValueDatabase: Optimal value unknown." << endl;
            if (args.testMode) // raise error when testing
                errorOccurred=true;
            else // otherwise save new value
                try { db.SetOptimalValue(V);}  
                catch(E& e){ e.Print(); }
        }
    }
    else // approximate methods
    {
        if(db.IsInDatabase())
        {
            cout << "OptimalValueDatabase: Computed value is " << V / db.GetOptimalValue()
                 << " of optimal (value " << db.GetOptimalValue() << ")"
                 << endl;
            if (V>db.GetOptimalValue())
                errorOccurred=true;
        }
        else
        {
            cout << "OptimalValueDatabase: Optimal value unknown." << endl;
            if (args.testMode) // raise error when testing
                errorOccurred=true;
        }
    }

    if(!args.dryrun)
    {
        of << horizon<<"\t";
        char s[10];
        sprintf(s, "%.6f", V);
        of << s <<"\t";
        of << ticks <<"\t";
        of << utime <<"\t";
        of << time_maa <<"\t";
        of << utime_maa <<"\t";
        of << time_Qcomp <<"\t";
        of << utime_Qcomp <<"\t";
        of << gmaa->GetNrEvaluatedJPolBGs() <<"\t";
        of << gmaa->GetMaxJPolPoolSize() <<"\t";
        //of << gmaa->GetJointPolicyPureVector()->GetIndex() <<"\t";
        of << gmaa->GetJointPolicyDiscretePure()->SoftPrintBrief() <<"\t";
        of << k <<"\n";
        of.flush();
    }

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        cout << endl << "Timing summary"<<endl;
        Time.PrintSummary();
        gmaa->PrintTimersSummary();
    }
    if(args.saveTimings && !args.dryrun)
        gmaa->SaveTimers(timingsFilename);

    }
    catch(E& e){ e.Print(); }

    return errorOccurred;
}